

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SetElementI<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  long *value;
  Var value_00;
  Var value_01;
  bool bVar2;
  JavascriptArray *array;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  value = *(long **)(this + (ulong)(playout->
                                   super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                   ).Instance * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  value_00 = *(Var *)(this + (ulong)(playout->
                                    super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                    ).Element * 8 + 0x160);
  ValidateRegValue(this,value_00,false,true);
  value_01 = *(Var *)(this + (ulong)(playout->
                                    super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                    ).Value * 8 + 0x160);
  ValidateRegValue(this,value_01,false,true);
  bVar2 = VarIs<Js::RecyclableObject>(value);
  if ((bVar2) && (*value == VirtualTableInfo<Js::JavascriptArray>::Address)) {
    bVar2 = JavascriptOperators::SetElementMayHaveImplicitCalls(*(ScriptContext **)(this + 0x78));
    if (!bVar2) {
      array = UnsafeVarTo<Js::JavascriptArray>(value);
      ProfilingHelpers::ProfiledStElem_FastPath
                (array,value_00,value_01,*(ScriptContext **)(this + 0x78),flags,(StElemInfo *)0x0);
      goto LAB_00a6d47d;
    }
  }
  JavascriptOperators::OP_SetElementI
            (value,value_00,value_01,*(ScriptContext **)(this + 0x78),flags);
LAB_00a6d47d:
  this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xef);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetElementI(const unaligned T* playout, PropertyOperationFlags flags)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Same fast path as in the backend.

        Var instance = GetReg(playout->Instance);
        const Var varIndex = GetReg(playout->Element);
        const Var value = GetReg(playout->Value);

#if ENABLE_PROFILE_INFO
        // Only enable fast path if the javascript array is not cross site
        if (!TaggedNumber::Is(instance) &&
            VirtualTableInfo<JavascriptArray>::HasVirtualTable(instance) &&
            !JavascriptOperators::SetElementMayHaveImplicitCalls(GetScriptContext()))
        {
            ProfilingHelpers::ProfiledStElem_FastPath(
                UnsafeVarTo<JavascriptArray>(instance),
                varIndex,
                value,
                GetScriptContext(),
                flags);
        }
        else
#endif
        {
            JavascriptOperators::OP_SetElementI(instance, varIndex, value, GetScriptContext(), flags);
        }

        this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }